

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

string * __thiscall
anon_unknown.dwarf_1190e7c::cmFileListGeneratorGlob::GetNextCandidate
          (string *__return_storage_ptr__,cmFileListGeneratorGlob *this,string *parent)

{
  pointer pcVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar3;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inName;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string expr;
  Glob g;
  undefined1 local_90 [32];
  undefined1 local_70 [16];
  _Alloc_hider local_60;
  char *pcStack_58;
  
  pbVar4 = (this->Files).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->Files).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start == pbVar4) {
    local_60._M_p = (pointer)(this->Pattern)._M_len;
    pcStack_58 = (this->Pattern)._M_str;
    views._M_len = 2;
    views._M_array = (iterator)local_70;
    local_70._8_8_ = parent;
    cmCatViews_abi_cxx11_((string *)local_90,views);
    cmsys::Glob::Glob((Glob *)local_70);
    bVar2 = cmsys::Glob::FindFiles((Glob *)local_70,(string *)local_90,(GlobMessages *)0x0);
    if (bVar2) {
      __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->Files,__x);
      (this->Current)._M_current =
           (this->Files).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    cmsys::Glob::~Glob((Glob *)local_70);
    psVar3 = (string *)(local_90 + 0x10);
    if ((string *)local_90._0_8_ != psVar3) {
      operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
      psVar3 = extraout_RAX;
    }
    if (!bVar2) {
      return psVar3;
    }
    pbVar4 = (this->Files).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  inName = (this->Current)._M_current;
  while (inName != pbVar4) {
    bVar2 = cmsys::SystemTools::FileIsDirectory(inName);
    pbVar4 = (this->Files).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    inName = (this->Current)._M_current;
    if (bVar2) break;
    inName = inName + 1;
    (this->Current)._M_current = inName;
  }
  if (inName == pbVar4) {
    psVar3 = (string *)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar3;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (this->Current)._M_current = inName + 1;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (inName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + inName->_M_string_length);
    psVar3 = extraout_RAX_00;
  }
  return psVar3;
}

Assistant:

std::string GetNextCandidate(const std::string& parent)
  {
    if (this->Files.empty()) {
      // Glob the set of matching files.
      std::string expr = cmStrCat(parent, this->Pattern);
      cmsys::Glob g;
      if (!g.FindFiles(expr)) {
        return {};
      }
      this->Files = g.GetFiles();
      this->Current = this->Files.cbegin();
    }

    // Skip non-directories
    for (; this->Current != this->Files.cend() &&
         !cmSystemTools::FileIsDirectory(*this->Current);
         ++this->Current) {
    }

    return (this->Current != this->Files.cend()) ? *this->Current++
                                                 : std::string{};
  }